

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

char * __thiscall
flatbuffers::JsonPrinter::PrintOffset
          (JsonPrinter *this,void *val,Type *type,int indent,uint8_t *prev_val,
          soffset_t vector_index)

{
  bool bVar1;
  uint uVar2;
  EnumVal *pEVar3;
  char *pcVar4;
  char *err_36;
  char *err_35;
  char *err_34;
  char *err_33;
  char *err_32;
  char *err_31;
  char *err_30;
  char *err_29;
  char *err_28;
  char *err_27;
  char *err_26;
  char *err_25;
  char *err_24;
  char *err_23;
  char *err_22;
  char *err_21;
  char *err_20;
  char *err_19;
  Type vec_type_1;
  char *err_18;
  char *err_17;
  char *err_16;
  char *err_15;
  char *err_14;
  char *err_13;
  char *err_12;
  char *err_11;
  char *err_10;
  char *err_9;
  char *err_8;
  char *err_7;
  char *err_6;
  char *err_5;
  char *err_4;
  char *err_3;
  char *err_2;
  char *err_1;
  char *err;
  Type vec_type;
  bool ok;
  String *s;
  EnumVal *enum_val;
  Vector<unsigned_char,_unsigned_int> *type_vec;
  uint8_t union_type_byte;
  soffset_t vector_index_local;
  uint8_t *prev_val_local;
  int indent_local;
  Type *type_local;
  void *val_local;
  JsonPrinter *this_local;
  
  switch(type->base_type) {
  case BASE_TYPE_STRING:
    pcVar4 = String::c_str((String *)val);
    uVar2 = Vector<char,_unsigned_int>::size((Vector<char,_unsigned_int> *)val);
    bVar1 = EscapeString(pcVar4,(ulong)uVar2,this->text,(bool)(this->opts->allow_non_utf8 & 1),
                         (bool)(this->opts->natural_utf8 & 1));
    this_local = (JsonPrinter *)"string contains non-utf8 bytes";
    if (bVar1) {
      this_local = (JsonPrinter *)0x0;
    }
    break;
  case BASE_TYPE_VECTOR:
    Type::VectorType((Type *)&err,type);
    switch(err._0_4_) {
    case 0:
      pcVar4 = PrintVector<unsigned_char,unsigned_int>(this,val,(Type *)&err,indent,prev_val);
      goto joined_r0x001a6ce9;
    case 1:
      pcVar4 = PrintVector<unsigned_char,unsigned_int>(this,val,(Type *)&err,indent,prev_val);
      goto joined_r0x001a6ce9;
    case 2:
      pcVar4 = PrintVector<unsigned_char,unsigned_int>(this,val,(Type *)&err,indent,prev_val);
joined_r0x001a6ce9:
      if (pcVar4 != (char *)0x0) {
        return pcVar4;
      }
      goto switchD_001a6c44_default;
    case 3:
      this_local = (JsonPrinter *)
                   PrintVector<signed_char,unsigned_int>(this,val,(Type *)&err,indent,prev_val);
      break;
    case 4:
      this_local = (JsonPrinter *)
                   PrintVector<unsigned_char,unsigned_int>(this,val,(Type *)&err,indent,prev_val);
      break;
    case 5:
      this_local = (JsonPrinter *)
                   PrintVector<short,unsigned_int>(this,val,(Type *)&err,indent,prev_val);
      break;
    case 6:
      this_local = (JsonPrinter *)
                   PrintVector<unsigned_short,unsigned_int>(this,val,(Type *)&err,indent,prev_val);
      break;
    case 7:
      this_local = (JsonPrinter *)
                   PrintVector<int,unsigned_int>(this,val,(Type *)&err,indent,prev_val);
      break;
    case 8:
      this_local = (JsonPrinter *)
                   PrintVector<unsigned_int,unsigned_int>(this,val,(Type *)&err,indent,prev_val);
      break;
    case 9:
      this_local = (JsonPrinter *)
                   PrintVector<long,unsigned_int>(this,val,(Type *)&err,indent,prev_val);
      break;
    case 10:
      this_local = (JsonPrinter *)
                   PrintVector<unsigned_long,unsigned_int>(this,val,(Type *)&err,indent,prev_val);
      break;
    case 0xb:
      this_local = (JsonPrinter *)
                   PrintVector<float,unsigned_int>(this,val,(Type *)&err,indent,prev_val);
      break;
    case 0xc:
      this_local = (JsonPrinter *)
                   PrintVector<double,unsigned_int>(this,val,(Type *)&err,indent,prev_val);
      break;
    case 0xd:
      this_local = (JsonPrinter *)
                   PrintVector<flatbuffers::Offset<void>,unsigned_int>
                             (this,val,(Type *)&err,indent,prev_val);
      break;
    case 0xe:
      this_local = (JsonPrinter *)
                   PrintVector<flatbuffers::Offset<void>,unsigned_int>
                             (this,val,(Type *)&err,indent,prev_val);
      break;
    case 0xf:
      this_local = (JsonPrinter *)
                   PrintVector<flatbuffers::Offset<void>,unsigned_int>
                             (this,val,(Type *)&err,indent,prev_val);
      break;
    case 0x10:
      this_local = (JsonPrinter *)
                   PrintVector<flatbuffers::Offset<void>,unsigned_int>
                             (this,val,(Type *)&err,indent,prev_val);
      break;
    case 0x11:
      this_local = (JsonPrinter *)
                   PrintVector<int,unsigned_int>(this,val,(Type *)&err,indent,prev_val);
      break;
    case 0x12:
      this_local = (JsonPrinter *)
                   PrintVector<flatbuffers::Offset64<void>,unsigned_int>
                             (this,val,(Type *)&err,indent,prev_val);
      break;
    default:
      goto switchD_001a6c44_default;
    }
    if (this_local == (JsonPrinter *)0x0) {
switchD_001a6c44_default:
      this_local = (JsonPrinter *)0x0;
    }
    break;
  case BASE_TYPE_STRUCT:
    this_local = (JsonPrinter *)GenStruct(this,type->struct_def,(Table *)val,indent);
    break;
  case BASE_TYPE_UNION:
    if (prev_val == (uint8_t *)0x0) {
      __assert_fail("prev_val",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_text.cpp"
                    ,0xb9,
                    "const char *flatbuffers::JsonPrinter::PrintOffset(const void *, const Type &, int, const uint8_t *, soffset_t)"
                   );
    }
    type_vec._3_1_ = *prev_val;
    if (-1 < vector_index) {
      uVar2 = ReadScalar<unsigned_int>(prev_val);
      type_vec._3_1_ =
           Vector<unsigned_char,_unsigned_int>::Get
                     ((Vector<unsigned_char,_unsigned_int> *)(prev_val + uVar2),vector_index);
    }
    pEVar3 = EnumDef::ReverseLookup(type->enum_def,(ulong)type_vec._3_1_,true);
    if (pEVar3 == (EnumVal *)0x0) {
      this_local = (JsonPrinter *)anon_var_dwarf_a2796;
    }
    else {
      this_local = (JsonPrinter *)PrintOffset(this,val,&pEVar3->union_type,indent,(uint8_t *)0x0,-1)
      ;
    }
    break;
  case BASE_TYPE_ARRAY:
    Type::VectorType((Type *)&err_19,type);
    switch(err_19._0_4_) {
    case 0:
      pcVar4 = PrintArray<unsigned_char>(this,val,type->fixed_length,(Type *)&err_19,indent);
      goto joined_r0x001a71d3;
    case 1:
      pcVar4 = PrintArray<unsigned_char>(this,val,type->fixed_length,(Type *)&err_19,indent);
joined_r0x001a71d3:
      if (pcVar4 != (char *)0x0) {
        return pcVar4;
      }
      goto switchD_001a7150_default;
    case 2:
      this_local = (JsonPrinter *)
                   PrintArray<unsigned_char>(this,val,type->fixed_length,(Type *)&err_19,indent);
      break;
    case 3:
      this_local = (JsonPrinter *)
                   PrintArray<signed_char>(this,val,type->fixed_length,(Type *)&err_19,indent);
      break;
    case 4:
      this_local = (JsonPrinter *)
                   PrintArray<unsigned_char>(this,val,type->fixed_length,(Type *)&err_19,indent);
      break;
    case 5:
      this_local = (JsonPrinter *)
                   PrintArray<short>(this,val,type->fixed_length,(Type *)&err_19,indent);
      break;
    case 6:
      this_local = (JsonPrinter *)
                   PrintArray<unsigned_short>(this,val,type->fixed_length,(Type *)&err_19,indent);
      break;
    case 7:
      this_local = (JsonPrinter *)
                   PrintArray<int>(this,val,type->fixed_length,(Type *)&err_19,indent);
      break;
    case 8:
      this_local = (JsonPrinter *)
                   PrintArray<unsigned_int>(this,val,type->fixed_length,(Type *)&err_19,indent);
      break;
    case 9:
      this_local = (JsonPrinter *)
                   PrintArray<long>(this,val,type->fixed_length,(Type *)&err_19,indent);
      break;
    case 10:
      this_local = (JsonPrinter *)
                   PrintArray<unsigned_long>(this,val,type->fixed_length,(Type *)&err_19,indent);
      break;
    case 0xb:
      this_local = (JsonPrinter *)
                   PrintArray<float>(this,val,type->fixed_length,(Type *)&err_19,indent);
      break;
    case 0xc:
      this_local = (JsonPrinter *)
                   PrintArray<double>(this,val,type->fixed_length,(Type *)&err_19,indent);
      break;
    case 0xd:
      this_local = (JsonPrinter *)
                   PrintArray<flatbuffers::Offset<void>>
                             (this,val,type->fixed_length,(Type *)&err_19,indent);
      break;
    case 0xe:
      this_local = (JsonPrinter *)
                   PrintArray<flatbuffers::Offset<void>>
                             (this,val,type->fixed_length,(Type *)&err_19,indent);
      break;
    case 0xf:
      this_local = (JsonPrinter *)
                   PrintArray<flatbuffers::Offset<void>>
                             (this,val,type->fixed_length,(Type *)&err_19,indent);
      break;
    case 0x10:
      this_local = (JsonPrinter *)
                   PrintArray<flatbuffers::Offset<void>>
                             (this,val,type->fixed_length,(Type *)&err_19,indent);
      break;
    case 0x11:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_text.cpp"
                    ,0xee,
                    "const char *flatbuffers::JsonPrinter::PrintOffset(const void *, const Type &, int, const uint8_t *, soffset_t)"
                   );
    case 0x12:
      this_local = (JsonPrinter *)
                   PrintArray<flatbuffers::Offset64<void>>
                             (this,val,type->fixed_length,(Type *)&err_19,indent);
      break;
    default:
      goto switchD_001a7150_default;
    }
    if (this_local == (JsonPrinter *)0x0) {
switchD_001a7150_default:
      this_local = (JsonPrinter *)0x0;
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_text.cpp"
                  ,0xf3,
                  "const char *flatbuffers::JsonPrinter::PrintOffset(const void *, const Type &, int, const uint8_t *, soffset_t)"
                 );
  }
  return (char *)this_local;
}

Assistant:

const char *PrintOffset(const void *val, const Type &type, int indent,
                          const uint8_t *prev_val, soffset_t vector_index) {
    switch (type.base_type) {
      case BASE_TYPE_UNION: {
        // If this assert hits, you have an corrupt buffer, a union type field
        // was not present or was out of range.
        FLATBUFFERS_ASSERT(prev_val);
        auto union_type_byte = *prev_val;  // Always a uint8_t.
        if (vector_index >= 0) {
          auto type_vec = reinterpret_cast<const Vector<uint8_t> *>(
              prev_val + ReadScalar<uoffset_t>(prev_val));
          union_type_byte = type_vec->Get(static_cast<uoffset_t>(vector_index));
        }
        auto enum_val = type.enum_def->ReverseLookup(union_type_byte, true);
        if (enum_val) {
          return PrintOffset(val, enum_val->union_type, indent, nullptr, -1);
        } else {
          return "unknown enum value";
        }
      }
      case BASE_TYPE_STRUCT:
        return GenStruct(*type.struct_def, reinterpret_cast<const Table *>(val),
                         indent);
      case BASE_TYPE_STRING: {
        auto s = reinterpret_cast<const String *>(val);
        bool ok = EscapeString(s->c_str(), s->size(), &text,
                               opts.allow_non_utf8, opts.natural_utf8);
        return ok ? nullptr : "string contains non-utf8 bytes";
      }
      case BASE_TYPE_VECTOR: {
        const auto vec_type = type.VectorType();
        // Call PrintVector above specifically for each element type:
        // clang-format off
        switch (vec_type.base_type) {
        #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
          case BASE_TYPE_ ## ENUM: { \
            auto err = PrintVector<CTYPE>(val, vec_type, indent, prev_val); \
            if (err) return err; \
            break; }
          FLATBUFFERS_GEN_TYPES(FLATBUFFERS_TD)
        #undef FLATBUFFERS_TD
        }
        // clang-format on
        return nullptr;
      }
      case BASE_TYPE_ARRAY: {
        const auto vec_type = type.VectorType();
        // Call PrintArray above specifically for each element type:
        // clang-format off
        switch (vec_type.base_type) {
        #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
          case BASE_TYPE_ ## ENUM: { \
            auto err = PrintArray<CTYPE>(val, type.fixed_length, vec_type, indent); \
            if (err) return err; \
            break; }
            FLATBUFFERS_GEN_TYPES_SCALAR(FLATBUFFERS_TD)
              // Arrays of scalars or structs are only possible.
              FLATBUFFERS_GEN_TYPES_POINTER(FLATBUFFERS_TD)
        #undef FLATBUFFERS_TD
          case BASE_TYPE_ARRAY: FLATBUFFERS_ASSERT(0);
        }
        // clang-format on
        return nullptr;
      }
      default: FLATBUFFERS_ASSERT(0); return "unknown type";
    }
  }